

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::DisconnectNode(CConnman *this,CSubNet *subnet)

{
  pointer ppCVar1;
  CNode *pCVar2;
  bool bVar3;
  char *args;
  pointer ppCVar4;
  bool bVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  NodeId local_98;
  allocator<char> local_89;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock94;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  bVar5 = false;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock94,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xe22,false);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    bVar3 = CSubNet::Match(subnet,(CNetAddr *)&pCVar2->addr);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(NET,Debug);
      bVar5 = fLogIPs;
      if (bVar3) {
        if (fLogIPs == true) {
          CSubNet::ToString_abi_cxx11_(&local_78,subnet);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)0x6ce012,(char *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_89);
        }
        local_98 = pCVar2->id;
        logging_function._M_str = "DisconnectNode";
        logging_function._M_len = 0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        args = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
        LogPrintFormatInternal<std::__cxx11::string,long>
                  (logging_function,source_file,0xe25,NET,Debug,(ConstevalFormatString<2U>)0x688321,
                   &local_58,&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        if (bVar5 != false) {
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      bVar5 = true;
      LOCK();
      (pCVar2->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock94.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CSubNet& subnet)
{
    bool disconnected = false;
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (subnet.Match(pnode->addr)) {
            LogDebug(BCLog::NET, "disconnect by subnet%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", subnet.ToString()) : ""), pnode->GetId());
            pnode->fDisconnect = true;
            disconnected = true;
        }
    }
    return disconnected;
}